

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int parse_data(char *filepath,LYD_FORMAT informat,int *options,lyd_node *val_tree,char *rpc_act_file
              ,lyd_node **result)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  int *piVar4;
  uint local_5c;
  long lStack_58;
  int opts;
  lyd_node *rpc_act;
  lyd_node *data;
  lyxml_elem *xml;
  lyd_node **result_local;
  char *rpc_act_file_local;
  lyd_node *val_tree_local;
  int *options_local;
  LYD_FORMAT informat_local;
  char *filepath_local;
  
  lStack_58 = 0;
  local_5c = *options;
  options_local._4_4_ = informat;
  if (informat == LYD_UNKNOWN) {
    options_local._4_4_ = detect_data_format(filepath);
  }
  if (options_local._4_4_ == LYD_UNKNOWN) {
    fprintf(_stderr,
            "Unable to resolve format of the input file, please add \".xml\", \".json\", or \".lyb\" suffix.\n"
           );
    return 1;
  }
  puVar2 = (undefined4 *)ly_errno_glob_address();
  *puVar2 = 0;
  if ((local_5c & 0x10000ff) == 0x10000ff) {
    if (options_local._4_4_ != LYD_XML) {
      fprintf(_stderr,"Only XML data can be automatically explored.\n");
      return 1;
    }
    lVar3 = lyxml_parse_path(ctx,filepath,0);
    if (lVar3 == 0) {
      fprintf(_stderr,"Failed to parse XML data for automatic type detection.\n");
      return 1;
    }
    iVar1 = strcmp(*(char **)(lVar3 + 0x30),"data");
    if (iVar1 == 0) {
      fprintf(_stdout,"Parsing %s as complete datastore.\n",filepath);
      local_5c = local_5c & 0xfeffff00 | 0x20000;
    }
    else {
      iVar1 = strcmp(*(char **)(lVar3 + 0x30),"config");
      if (iVar1 == 0) {
        fprintf(_stdout,"Parsing %s as config data.\n",filepath);
        local_5c = local_5c & 0xfeffff00 | 1;
      }
      else {
        iVar1 = strcmp(*(char **)(lVar3 + 0x30),"get-reply");
        if (iVar1 == 0) {
          fprintf(_stdout,"Parsing %s as <get> reply data.\n",filepath);
          local_5c = local_5c & 0xfeffff00 | 2;
        }
        else {
          iVar1 = strcmp(*(char **)(lVar3 + 0x30),"get-config-reply");
          if (iVar1 == 0) {
            fprintf(_stdout,"Parsing %s as <get-config> reply data.\n",filepath);
            local_5c = local_5c & 0xfeffff00 | 4;
          }
          else {
            iVar1 = strcmp(*(char **)(lVar3 + 0x30),"edit-config");
            if (iVar1 == 0) {
              fprintf(_stdout,"Parsing %s as <edit-config> data.\n",filepath);
              local_5c = local_5c & 0xfeffff00 | 8;
            }
            else {
              iVar1 = strcmp(*(char **)(lVar3 + 0x30),"rpc");
              if (iVar1 == 0) {
                fprintf(_stdout,"Parsing %s as <rpc> data.\n",filepath);
                local_5c = local_5c & 0xfeffff00 | 0x10;
              }
              else {
                iVar1 = strcmp(*(char **)(lVar3 + 0x30),"rpc-reply");
                if (iVar1 == 0) {
                  if (rpc_act_file == (char *)0x0) {
                    fprintf(_stderr,
                            "RPC/action reply data require additional argument (file with the RPC/action).\n"
                           );
                    lyxml_free(ctx,lVar3);
                    return 1;
                  }
                  fprintf(_stdout,"Parsing %s as <rpc-reply> data.\n",filepath);
                  local_5c = local_5c & 0xfeffff00 | 0x20;
                  lStack_58 = lyd_parse_path(ctx,rpc_act_file,1,0x10,val_tree);
                  if (lStack_58 == 0) {
                    fprintf(_stderr,"Failed to parse RPC/action.\n");
                    lyxml_free(ctx,lVar3);
                    return 1;
                  }
                }
                else {
                  iVar1 = strcmp(*(char **)(lVar3 + 0x30),"notification");
                  if (iVar1 == 0) {
                    fprintf(_stdout,"Parsing %s as <notification> data.\n",filepath);
                    local_5c = local_5c & 0xfeffff00 | 0x40;
                  }
                  else {
                    iVar1 = strcmp(*(char **)(lVar3 + 0x30),"yang-data");
                    if (iVar1 != 0) {
                      fprintf(_stderr,
                              "Invalid top-level element for automatic data type recognition.\n");
                      lyxml_free(ctx,lVar3);
                      return 1;
                    }
                    fprintf(_stdout,"Parsing %s as <yang-data> data.\n",filepath);
                    local_5c = local_5c & 0xfeffff00 | 0x1000000;
                    if (rpc_act_file == (char *)0x0) {
                      fprintf(_stderr,
                              "YANG-DATA require additional argument (name instance of yang-data extension).\n"
                             );
                      lyxml_free(ctx,lVar3);
                      return 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((local_5c & 0x20) == 0) {
      if ((local_5c & 0x50) == 0) {
        if ((local_5c & 0x1000000) == 0) {
          rpc_act = (lyd_node *)lyd_parse_xml(ctx,lVar3 + 0x18,local_5c);
        }
        else {
          rpc_act = (lyd_node *)lyd_parse_xml(ctx,lVar3 + 0x18,local_5c,rpc_act_file);
        }
      }
      else {
        rpc_act = (lyd_node *)lyd_parse_xml(ctx,lVar3 + 0x18,local_5c,val_tree);
      }
    }
    else {
      rpc_act = (lyd_node *)lyd_parse_xml(ctx,lVar3 + 0x18,local_5c,lStack_58,val_tree);
    }
    lyxml_free(ctx,lVar3);
  }
  else if ((local_5c & 0x20) == 0) {
    if ((local_5c & 0x50) == 0) {
      if ((local_5c & 0x1000000) == 0) {
        if ((local_5c & 0x10000ff) == 0) {
          local_5c = local_5c | 0x20000;
        }
        rpc_act = (lyd_node *)lyd_parse_path(ctx,filepath,options_local._4_4_,local_5c);
      }
      else {
        if (rpc_act_file == (char *)0x0) {
          fprintf(_stderr,
                  "YANG-DATA require additional argument (name instance of yang-data extension).\n")
          ;
          return 1;
        }
        rpc_act = (lyd_node *)lyd_parse_path(ctx,filepath,options_local._4_4_,local_5c,rpc_act_file)
        ;
      }
    }
    else {
      rpc_act = (lyd_node *)lyd_parse_path(ctx,filepath,options_local._4_4_,local_5c,val_tree);
    }
  }
  else {
    if (rpc_act_file == (char *)0x0) {
      fprintf(_stderr,
              "RPC/action reply data require additional argument (file with the RPC/action).\n");
      return 1;
    }
    lStack_58 = lyd_parse_path(ctx,rpc_act_file,options_local._4_4_,0x10,val_tree);
    if (lStack_58 == 0) {
      fprintf(_stderr,"Failed to parse RPC/action.\n");
      return 1;
    }
    rpc_act = (lyd_node *)
              lyd_parse_path(ctx,filepath,options_local._4_4_,local_5c,lStack_58,val_tree);
  }
  lyd_free_withsiblings(lStack_58);
  piVar4 = (int *)ly_errno_glob_address();
  iVar1 = *piVar4;
  if (iVar1 == 0) {
    *result = rpc_act;
    *options = local_5c;
  }
  else {
    fprintf(_stderr,"Failed to parse data.\n");
    lyd_free_withsiblings(rpc_act);
  }
  filepath_local._4_4_ = (uint)(iVar1 != 0);
  return filepath_local._4_4_;
}

Assistant:

static int
parse_data(char *filepath, LYD_FORMAT informat, int *options, struct lyd_node *val_tree, const char *rpc_act_file,
           struct lyd_node **result)
{
    struct lyxml_elem *xml = NULL;
    struct lyd_node *data = NULL, *rpc_act = NULL;
    int opts = *options;

    if (informat == LYD_UNKNOWN) {
        /* detect input format according to file suffix */
        informat = detect_data_format(filepath);
    }
    if (informat == LYD_UNKNOWN) {
        fprintf(stderr, "Unable to resolve format of the input file, please add \".xml\", \".json\", or \".lyb\" suffix.\n");
        return EXIT_FAILURE;
    }

    ly_errno = LY_SUCCESS;

    if ((opts & LYD_OPT_TYPEMASK) == LYD_OPT_TYPEMASK) {
        /* automatically detect data type from the data top level */
        if (informat != LYD_XML) {
            fprintf(stderr, "Only XML data can be automatically explored.\n");
            return EXIT_FAILURE;
        }

        xml = lyxml_parse_path(ctx, filepath, 0);
        if (!xml) {
            fprintf(stderr, "Failed to parse XML data for automatic type detection.\n");
            return EXIT_FAILURE;
        }

        /* NOTE: namespace is ignored to simplify usage of this feature */

        if (!strcmp(xml->name, "data")) {
            fprintf(stdout, "Parsing %s as complete datastore.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_ADD_YANGLIB;
        } else if (!strcmp(xml->name, "config")) {
            fprintf(stdout, "Parsing %s as config data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_CONFIG;
        } else if (!strcmp(xml->name, "get-reply")) {
            fprintf(stdout, "Parsing %s as <get> reply data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_GET;
        } else if (!strcmp(xml->name, "get-config-reply")) {
            fprintf(stdout, "Parsing %s as <get-config> reply data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_GETCONFIG;
        } else if (!strcmp(xml->name, "edit-config")) {
            fprintf(stdout, "Parsing %s as <edit-config> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_EDIT;
        } else if (!strcmp(xml->name, "rpc")) {
            fprintf(stdout, "Parsing %s as <rpc> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPC;
        } else if (!strcmp(xml->name, "rpc-reply")) {
            if (!rpc_act_file) {
                fprintf(stderr, "RPC/action reply data require additional argument (file with the RPC/action).\n");
                lyxml_free(ctx, xml);
                return EXIT_FAILURE;
            }
            fprintf(stdout, "Parsing %s as <rpc-reply> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPCREPLY;
            rpc_act = lyd_parse_path(ctx, rpc_act_file, informat, LYD_OPT_RPC, val_tree);
            if (!rpc_act) {
                fprintf(stderr, "Failed to parse RPC/action.\n");
                lyxml_free(ctx, xml);
                return EXIT_FAILURE;
            }
        } else if (!strcmp(xml->name, "notification")) {
            fprintf(stdout, "Parsing %s as <notification> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_NOTIF;
        } else if (!strcmp(xml->name, "yang-data")) {
            fprintf(stdout, "Parsing %s as <yang-data> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_TEMPLATE;
            if (!rpc_act_file) {
                fprintf(stderr, "YANG-DATA require additional argument (name instance of yang-data extension).\n");
                lyxml_free(ctx, xml);
                return EXIT_FAILURE;
            }
        } else {
            fprintf(stderr, "Invalid top-level element for automatic data type recognition.\n");
            lyxml_free(ctx, xml);
            return EXIT_FAILURE;
        }

        if (opts & LYD_OPT_RPCREPLY) {
            data = lyd_parse_xml(ctx, &xml->child, opts, rpc_act, val_tree);
        } else if (opts & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            data = lyd_parse_xml(ctx, &xml->child, opts, val_tree);
        } else if (opts & LYD_OPT_DATA_TEMPLATE) {
            data = lyd_parse_xml(ctx, &xml->child, opts, rpc_act_file);
        } else {
            data = lyd_parse_xml(ctx, &xml->child, opts);
        }
        lyxml_free(ctx, xml);
    } else {
        if (opts & LYD_OPT_RPCREPLY) {
            if (!rpc_act_file) {
                fprintf(stderr, "RPC/action reply data require additional argument (file with the RPC/action).\n");
                return EXIT_FAILURE;
            }
            rpc_act = lyd_parse_path(ctx, rpc_act_file, informat, LYD_OPT_RPC, val_tree);
            if (!rpc_act) {
                fprintf(stderr, "Failed to parse RPC/action.\n");
                return EXIT_FAILURE;
            }
            data = lyd_parse_path(ctx, filepath, informat, opts, rpc_act, val_tree);
        } else if (opts & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            data = lyd_parse_path(ctx, filepath, informat, opts, val_tree);
        } else if (opts & LYD_OPT_DATA_TEMPLATE) {
            if (!rpc_act_file) {
                fprintf(stderr, "YANG-DATA require additional argument (name instance of yang-data extension).\n");
                return EXIT_FAILURE;
            }
            data = lyd_parse_path(ctx, filepath, informat, opts, rpc_act_file);
        } else {
            if (!(opts & LYD_OPT_TYPEMASK)) {
                /* automatically add yang-library data */
                opts |= LYD_OPT_DATA_ADD_YANGLIB;
            }
            data = lyd_parse_path(ctx, filepath, informat, opts);
        }
    }
    lyd_free_withsiblings(rpc_act);

    if (ly_errno) {
        fprintf(stderr, "Failed to parse data.\n");
        lyd_free_withsiblings(data);
        return EXIT_FAILURE;
    }

    *result = data;
    *options = opts;
    return EXIT_SUCCESS;
}